

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state_tests.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::anon_unknown_0::MMIOWriteDmaTest::MMIOWriteDmaTest
          (MMIOWriteDmaTest *this,TestOptions *opt,uint32_t seed)

{
  uint32_t seed_local;
  TestOptions *opt_local;
  MMIOWriteDmaTest *this_local;
  
  StateTest::StateTest(&this->super_StateTest,opt,seed);
  (this->super_StateTest).super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__MMIOWriteDmaTest_003f6a10;
  if ((this->super_StateTest).super_RepeatTest.super_Test.chipset.card_type < 4) {
    pgraph_dma_nv3_regs(&this->regs,&(this->super_StateTest).super_RepeatTest.super_Test.chipset);
  }
  else {
    pgraph_dma_nv4_regs(&this->regs,&(this->super_StateTest).super_RepeatTest.super_Test.chipset);
  }
  std::__cxx11::string::string((string *)&this->name);
  return;
}

Assistant:

MMIOWriteDmaTest(hwtest::TestOptions &opt, uint32_t seed) : StateTest(opt, seed),
		regs(chipset.card_type < 4 ? pgraph_dma_nv3_regs(chipset) : pgraph_dma_nv4_regs(chipset)) {}